

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O3

QString * QFileSystemEngine::resolveUserName(QString *__return_storage_ptr__,uint userId)

{
  passwd *ppVar1;
  storage_type *in_RCX;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArray local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  ppVar1 = getpwuid(userId);
  if (ppVar1 == (passwd *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
  }
  else {
    QByteArray::QByteArray(&local_30,ppVar1->pw_name,-1);
    ba.m_data = in_RCX;
    ba.m_size = (qsizetype)local_30.d.ptr;
    QString::fromLocal8Bit(__return_storage_ptr__,(QString *)local_30.d.size,ba);
    if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_30.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QString QFileSystemEngine::resolveUserName(uint userId)
{
#if QT_CONFIG(thread) && defined(_POSIX_THREAD_SAFE_FUNCTIONS) && !defined(Q_OS_OPENBSD)
    long size_max = sysconf(_SC_GETPW_R_SIZE_MAX);
    if (size_max == -1)
        size_max = 1024;
    QVarLengthArray<char, 1024> buf(size_max);
#endif

#if !defined(Q_OS_INTEGRITY) && !defined(Q_OS_WASM)
    struct passwd *pw = nullptr;
#if QT_CONFIG(thread) && defined(_POSIX_THREAD_SAFE_FUNCTIONS) && !defined(Q_OS_OPENBSD) && !defined(Q_OS_VXWORKS)
    struct passwd entry;
    getpwuid_r(userId, &entry, buf.data(), buf.size(), &pw);
#else
    pw = getpwuid(userId);
#endif
    if (pw)
        return QFile::decodeName(QByteArray(pw->pw_name));
#else // Integrity || WASM
    Q_UNUSED(userId);
#endif
    return QString();
}